

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_index_load(BGZF *fp,char *bname,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  FILE *__stream;
  bgzidx_t *pbVar3;
  bgzidx1_t *pbVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint64_t x;
  ulong local_40;
  FILE *local_38;
  
  if (suffix == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(bname);
    sVar2 = strlen(suffix);
    iVar6 = (int)sVar1;
    __dest = (char *)malloc((long)((int)sVar2 + iVar6 + 1));
    if (__dest == (char *)0x0) {
      return -1;
    }
    memcpy(__dest,bname,(long)iVar6);
    memcpy(__dest + iVar6,suffix,(long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
  }
  if (__dest != (char *)0x0) {
    bname = __dest;
  }
  __stream = fopen(bname,"rb");
  if (__dest != (char *)0x0) {
    free(__dest);
  }
  if (__stream == (FILE *)0x0) {
    return -1;
  }
  pbVar3 = (bgzidx_t *)calloc(1,0x18);
  fp->idx = pbVar3;
  sVar1 = fread(&local_40,1,8,__stream);
  if (sVar1 != 8) {
    return -1;
  }
  uVar5 = (uint)(byte)(local_40 >> 0x38) | ((uint)(local_40 >> 0x20) & 0xff0000) >> 8 |
          (uint)(local_40 >> 0x18) & 0xff0000 | (uint)(local_40 >> 8) & 0xff000000;
  if (((undefined1  [96])*fp & (undefined1  [96])0xc0000) == (undefined1  [96])0x0) {
    uVar5 = (uint)local_40;
  }
  iVar6 = uVar5 + 1;
  pbVar3 = fp->idx;
  pbVar3->moffs = iVar6;
  pbVar3->noffs = iVar6;
  pbVar4 = (bgzidx1_t *)malloc((long)iVar6 << 4);
  pbVar3->offs = pbVar4;
  pbVar4->uaddr = 0;
  pbVar4->caddr = 0;
  iVar6 = fp->idx->noffs;
  if ((fp->field_0x2 & 0xc) == 0) {
    uVar9 = 0;
    if (iVar6 < 2) goto LAB_00134dd4;
    lVar7 = 1;
    lVar8 = 0;
    do {
      sVar1 = fread(&local_40,1,8,__stream);
      *(ulong *)((long)&fp->idx->offs[1].caddr + lVar8) = local_40;
      sVar2 = fread(&local_40,1,8,__stream);
      uVar5 = (int)sVar2 + (int)sVar1 + (int)uVar9;
      uVar9 = (ulong)uVar5;
      pbVar3 = fp->idx;
      *(ulong *)((long)&pbVar3->offs[1].uaddr + lVar8) = local_40;
      lVar7 = lVar7 + 1;
      iVar6 = pbVar3->noffs;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < iVar6);
  }
  else {
    uVar9 = 0;
    if (iVar6 < 2) goto LAB_00134dd4;
    lVar7 = 1;
    lVar8 = 0;
    local_38 = __stream;
    do {
      sVar1 = fread(&local_40,1,8,local_38);
      __stream = local_38;
      *(ulong *)((long)&fp->idx->offs[1].caddr + lVar8) =
           local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
           (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
           (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
           (local_40 & 0xff00) << 0x28 | local_40 << 0x38;
      sVar2 = fread(&local_40,1,8,local_38);
      uVar5 = (int)sVar2 + (int)sVar1 + (int)uVar9;
      uVar9 = (ulong)uVar5;
      pbVar3 = fp->idx;
      *(ulong *)((long)&pbVar3->offs[1].uaddr + lVar8) =
           local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
           (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
           (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
           (local_40 & 0xff00) << 0x28 | local_40 << 0x38;
      lVar7 = lVar7 + 1;
      iVar6 = pbVar3->noffs;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < iVar6);
  }
  uVar9 = (ulong)(int)uVar5;
LAB_00134dd4:
  if ((long)iVar6 * 0x10 - 0x10U == uVar9) {
    fclose(__stream);
    return 0;
  }
  return -1;
}

Assistant:

int bgzf_index_load(BGZF *fp, const char *bname, const char *suffix)
{
    char *tmp = NULL;
    if ( suffix )
    {
        int blen = strlen(bname);
        int slen = strlen(suffix);
        tmp = (char*) malloc(blen + slen + 1);
        if ( !tmp ) return -1;
        memcpy(tmp,bname,blen);
        memcpy(tmp+blen,suffix,slen+1);
    }

    FILE *idx = fopen(tmp?tmp:bname,"rb");
    if ( tmp ) free(tmp);
    if ( !idx ) return -1;

    fp->idx = (bgzidx_t*) calloc(1,sizeof(bgzidx_t));
    uint64_t x;
    if ( fread(&x, 1, sizeof(x), idx) != sizeof(x) ) return -1;

    fp->idx->noffs = fp->idx->moffs = 1 + (fp->is_be ? ed_swap_8(x) : x);
    fp->idx->offs  = (bgzidx1_t*) malloc(fp->idx->moffs*sizeof(bgzidx1_t));
    fp->idx->offs[0].caddr = fp->idx->offs[0].uaddr = 0;

    int i;
    if ( fp->is_be )
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = ed_swap_8(x);
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = ed_swap_8(x);
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    else
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = x;
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = x;
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    fclose(idx);
    return 0;

}